

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O1

void mbedtls_mpi_core_montmul
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t B_limbs,
               mbedtls_mpi_uint *N,size_t AN_limbs,mbedtls_mpi_uint mm,mbedtls_mpi_uint *T)

{
  mbedtls_mpi_uint b;
  mbedtls_mpi_uint mVar1;
  mbedtls_mpi_uint mVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  
  switchD_005700f1::default(T,0,AN_limbs << 4 | 8);
  if (AN_limbs != 0) {
    sVar6 = 0;
    do {
      b = A[sVar6];
      mVar1 = *B;
      mVar2 = *T;
      mbedtls_mpi_core_mla(T,AN_limbs + 2,B,B_limbs,b);
      mbedtls_mpi_core_mla(T,AN_limbs + 2,N,AN_limbs,(mVar1 * b + mVar2) * mm);
      T = T + 1;
      sVar6 = sVar6 + 1;
    } while (AN_limbs != sVar6);
  }
  uVar4 = T[AN_limbs];
  if (AN_limbs == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    sVar6 = 0;
    do {
      uVar5 = T[sVar6] - uVar3;
      uVar3 = (ulong)(uVar5 < N[sVar6]) + (ulong)(T[sVar6] < uVar3);
      X[sVar6] = uVar5 - N[sVar6];
      sVar6 = sVar6 + 1;
    } while (AN_limbs != sVar6);
  }
  uVar4 = uVar3 ^ uVar4 ^ mbedtls_ct_zero;
  mbedtls_ct_memcpy_if
            ((long)(-(uVar4 >> 1) | -uVar4) >> 0x3f,(uchar *)X,(uchar *)T,(uchar *)0x0,AN_limbs << 3
            );
  return;
}

Assistant:

void mbedtls_mpi_core_montmul(mbedtls_mpi_uint *X,
                              const mbedtls_mpi_uint *A,
                              const mbedtls_mpi_uint *B,
                              size_t B_limbs,
                              const mbedtls_mpi_uint *N,
                              size_t AN_limbs,
                              mbedtls_mpi_uint mm,
                              mbedtls_mpi_uint *T)
{
    memset(T, 0, (2 * AN_limbs + 1) * ciL);

    for (size_t i = 0; i < AN_limbs; i++) {
        /* T = (T + u0*B + u1*N) / 2^biL */
        mbedtls_mpi_uint u0 = A[i];
        mbedtls_mpi_uint u1 = (T[0] + u0 * B[0]) * mm;

        (void) mbedtls_mpi_core_mla(T, AN_limbs + 2, B, B_limbs, u0);
        (void) mbedtls_mpi_core_mla(T, AN_limbs + 2, N, AN_limbs, u1);

        T++;
    }

    /*
     * The result we want is (T >= N) ? T - N : T.
     *
     * For better constant-time properties in this function, we always do the
     * subtraction, with the result in X.
     *
     * We also look to see if there was any carry in the final additions in the
     * loop above.
     */

    mbedtls_mpi_uint carry  = T[AN_limbs];
    mbedtls_mpi_uint borrow = mbedtls_mpi_core_sub(X, T, N, AN_limbs);

    /*
     * Using R as the Montgomery radix (auxiliary modulus) i.e. 2^(biL*AN_limbs):
     *
     * T can be in one of 3 ranges:
     *
     * 1) T < N      : (carry, borrow) = (0, 1): we want T
     * 2) N <= T < R : (carry, borrow) = (0, 0): we want X
     * 3) T >= R     : (carry, borrow) = (1, 1): we want X
     *
     * and (carry, borrow) = (1, 0) can't happen.
     *
     * So the correct return value is already in X if (carry ^ borrow) = 0,
     * but is in (the lower AN_limbs limbs of) T if (carry ^ borrow) = 1.
     */
    mbedtls_ct_memcpy_if(mbedtls_ct_bool(carry ^ borrow),
                         (unsigned char *) X,
                         (unsigned char *) T,
                         NULL,
                         AN_limbs * sizeof(mbedtls_mpi_uint));
}